

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_svg.h
# Opt level: O0

Stroke * __thiscall svg::Stroke::toString_abi_cxx11_(Stroke *this,Layout *layout)

{
  double *pdVar1;
  ostream *poVar2;
  Layout *in_RDX;
  allocator local_2b9;
  string local_2b8 [32];
  Color local_298;
  allocator local_271;
  string local_270 [32];
  svg local_250 [39];
  allocator local_229;
  string local_228 [32];
  double local_208 [3];
  allocator local_1e9;
  string local_1e8 [32];
  svg local_1c8 [32];
  stringstream local_1a8 [8];
  stringstream ss;
  ostream local_198 [376];
  Layout *local_20;
  Layout *layout_local;
  Stroke *this_local;
  
  pdVar1 = &(layout->dimensions).height;
  layout_local = layout;
  this_local = this;
  if (0.0 < *pdVar1 || *pdVar1 == 0.0) {
    local_20 = in_RDX;
    std::__cxx11::stringstream::stringstream(local_1a8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1e8,"stroke-width",&local_1e9);
    local_208[0] = translateScale((layout->dimensions).height,local_20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_228,"",&local_229);
    attribute<double>(local_1c8,(string *)local_1e8,local_208,(string *)local_228);
    poVar2 = std::operator<<(local_198,(string *)local_1c8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_270,"stroke",&local_271);
    Color::toString_abi_cxx11_(&local_298,(Layout *)&layout->scale);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2b8,"",&local_2b9);
    attribute<std::__cxx11::string>
              (local_250,(string *)local_270,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_298,
               (string *)local_2b8);
    std::operator<<(poVar2,(string *)local_250);
    std::__cxx11::string::~string((string *)local_250);
    std::__cxx11::string::~string(local_2b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_2b9);
    std::__cxx11::string::~string((string *)&local_298);
    std::__cxx11::string::~string(local_270);
    std::allocator<char>::~allocator((allocator<char> *)&local_271);
    std::__cxx11::string::~string((string *)local_1c8);
    std::__cxx11::string::~string(local_228);
    std::allocator<char>::~allocator((allocator<char> *)&local_229);
    std::__cxx11::string::~string(local_1e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
    std::__cxx11::stringstream::str();
    std::__cxx11::stringstream::~stringstream(local_1a8);
  }
  else {
    std::__cxx11::string::string((string *)this);
  }
  return this;
}

Assistant:

std::string toString(Layout const & layout) const
        {
            // If stroke width is invalid.
            if (width < 0)
                return std::string();

            std::stringstream ss;
            ss << attribute("stroke-width", translateScale(width, layout)) << attribute("stroke", color.toString(layout));
            return ss.str();
        }